

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion.c
# Opt level: O3

void complete_cmd(char *buf,char *hint,linenoiseCompletions *lc)

{
  char cVar1;
  uint uVar2;
  linenoiseCompletions *lc_00;
  int iVar3;
  size_t sVar4;
  COMMAND *pCVar5;
  ulong uVar6;
  long lVar7;
  char *ptr;
  char *pcVar8;
  char *__s2;
  bool bVar9;
  bool bVar10;
  char opt [3];
  char **matches;
  undefined2 local_58;
  undefined1 local_56;
  uint local_54;
  char **local_50;
  linenoiseCompletions *local_48;
  char *local_40;
  char *local_38;
  
  local_56 = 0;
  local_58 = 0x3a00;
  local_50 = (char **)0x0;
  local_54 = 0;
  local_40 = hint;
  if (buf == hint) {
    local_50 = (char **)0x0;
    if (commands[0].name != (char *)0x0) {
      pCVar5 = commands;
      pcVar8 = commands[0].name;
      local_48 = lc;
      do {
        pCVar5 = pCVar5 + 1;
        sVar4 = strlen(hint);
        iVar3 = strncmp(hint,pcVar8,sVar4);
        if (iVar3 == 0) {
          cmd_completion_add_match(pcVar8,&local_50,&local_54);
        }
        pcVar8 = pCVar5->name;
      } while (pcVar8 != (char *)0x0);
LAB_00109bc7:
      lc_00 = local_48;
      if (local_54 != 0) {
        uVar6 = 0;
        do {
          linenoiseAddCompletion(lc_00,local_50[uVar6]);
          free(local_50[uVar6]);
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_54);
      }
    }
    free(local_50);
    return;
  }
  local_38 = hint + -1;
  lVar7 = 0;
  local_48 = lc;
LAB_00109a38:
  uVar2 = (&DAT_0011ca40)[lVar7 * 6];
  pcVar8 = commands[uVar2].name;
  sVar4 = strlen(pcVar8);
  iVar3 = strncmp(buf,pcVar8,sVar4);
  if ((iVar3 == 0) && (pcVar8 = local_38, buf[sVar4] == ' ')) {
    do {
      if (*pcVar8 != ' ') goto LAB_00109aa3;
      pcVar8 = pcVar8 + -1;
      __s2 = buf;
    } while (pcVar8 != buf);
    goto LAB_00109ab5;
  }
  goto LAB_00109b0a;
  while (pcVar8 = pcVar8 + -1, __s2 = buf, pcVar8 != buf) {
LAB_00109aa3:
    __s2 = pcVar8;
    if (pcVar8[-1] == ' ') break;
  }
LAB_00109ab5:
  if (*__s2 == '-') {
    cVar1 = __s2[1];
    local_58 = CONCAT11(local_58._1_1_,cVar1);
    pcVar8 = (char *)(&DAT_0011ca48)[lVar7 * 3];
    bVar9 = pcVar8 == (char *)0x0;
    bVar10 = cVar1 != '\0';
    if ((bVar10) && (pcVar8 == (char *)0x0)) {
      pcVar8 = strstr(commands[uVar2].optstring,(char *)&local_58);
      if (pcVar8 != (char *)0x0) goto LAB_00109b0a;
      goto LAB_00109b3f;
    }
    if ((cVar1 != '\0') && (pcVar8 != (char *)0x0)) {
      sVar4 = strlen(pcVar8);
      iVar3 = strncmp(pcVar8,__s2,sVar4);
      if (iVar3 == 0) goto LAB_00109b3f;
      goto LAB_00109b0a;
    }
  }
  else {
    local_58 = (ushort)local_58._1_1_ << 8;
    bVar9 = (&DAT_0011ca48)[lVar7 * 3] == 0;
    bVar10 = false;
  }
  if ((!bVar9) && (!bVar10)) {
LAB_00109b0a:
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x14) goto LAB_00109bc7;
    goto LAB_00109a38;
  }
LAB_00109b3f:
  if ((code *)(&DAT_0011ca50)[lVar7 * 3] == (code *)0x0) {
    path_completion(local_40,local_48);
  }
  else {
    (*(code *)(&DAT_0011ca50)[lVar7 * 3])(local_40,&local_50,&local_54);
  }
  goto LAB_00109bc7;
}

Assistant:

void
complete_cmd(const char *buf, const char *hint, linenoiseCompletions *lc)
{
    struct autocomplete {
        enum COMMAND_INDEX ci;      /**< command index to global variable 'commands' */
        const char *opt;            /**< optional option */
        void (*yl_cb)(const char *, char ***, unsigned int *);  /**< yanglint callback to call */
    } ac[] = {
        {CMD_ADD,         NULL,    NULL},
        {CMD_PRINT,       "-f",    get_print_format_arg},
        {CMD_PRINT,       "-P",    get_schema_completion},
        {CMD_PRINT,       "-o",    NULL},
        {CMD_PRINT,       NULL,    get_model_completion},
        {CMD_SEARCHPATH,  NULL,    NULL},
        {CMD_EXTDATA,     NULL,    NULL},
        {CMD_CLEAR,       "-Y",    NULL},
        {CMD_DATA,        "-t",    get_data_type_arg},
        {CMD_DATA,        "-O",    NULL},
        {CMD_DATA,        "-R",    NULL},
        {CMD_DATA,        "-f",    get_data_in_format_arg},
        {CMD_DATA,        "-F",    get_data_in_format_arg},
        {CMD_DATA,        "-d",    get_data_default_arg},
        {CMD_DATA,        "-o",    NULL},
        {CMD_DATA,        NULL,    NULL},
        {CMD_LIST,        NULL,    get_list_format_arg},
        {CMD_FEATURE,     NULL,    get_model_completion},
        {CMD_VERB,        NULL,    get_verb_arg},
        {CMD_DEBUG,       NULL,    get_debug_arg},
    };
    size_t name_len;
    const char *last, *name, *getoptstr;
    char opt[3] = {'\0', ':', '\0'};
    char **matches = NULL;
    unsigned int match_count = 0, i;

    if (buf == hint) {
        /* command autocomplete */
        get_cmd_completion(hint, &matches, &match_count);

    } else {
        for (i = 0; i < (sizeof ac / sizeof *ac); ++i) {
            /* Find the right command. */
            name = commands[ac[i].ci].name;
            name_len = strlen(name);
            if (strncmp(buf, name, name_len) || (buf[name_len] != ' ')) {
                /* not this command */
                continue;
            }

            /* Select based on the right option. */
            last = get_last_str(buf, hint);
            opt[0] = (last[0] == '-') && last[1] ? last[1] : '\0';
            getoptstr = commands[ac[i].ci].optstring;
            if (!ac[i].opt && opt[0] && strstr(getoptstr, opt)) {
                /* completion for the argument must be defined */
                continue;
            } else if (ac[i].opt && opt[0] && strncmp(ac[i].opt, last, strlen(ac[i].opt))) {
                /* completion for (another) option */
                continue;
            } else if (ac[i].opt && !opt[0]) {
                /* completion is defined for option */
                continue;
            }

            /* callback */
            if (ac[i].yl_cb) {
                ac[i].yl_cb(hint, &matches, &match_count);
            } else {
                path_completion(hint, lc);
            }
            break;
        }
    }

    /* transform matches into autocompletion, if needed */
    for (i = 0; i < match_count; ++i) {
        linenoiseAddCompletion(lc, matches[i]);
        free(matches[i]);
    }
    free(matches);
}